

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_crypto_three_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uint uVar7;
  uintptr_t o_8;
  int iVar8;
  uintptr_t o_1;
  code *pcVar9;
  TCGv_i64 pTVar10;
  uintptr_t o_2;
  long lVar11;
  uintptr_t o_3;
  uintptr_t o;
  TCGv_i64 pTVar12;
  TCGv_i64 tcg_res [2];
  TCGv_i64 local_48 [3];
  
  s_00 = s->uc->tcg_ctx;
  uVar7 = insn >> 10 & 3;
  if ((insn >> 0xe & 1) != 0) {
    uVar4 = 0xf000000000;
    switch(uVar7) {
    case 0:
      pcVar9 = gen_helper_crypto_sm3partw1;
      break;
    case 1:
      pcVar9 = gen_helper_crypto_sm3partw2;
      break;
    case 2:
      pcVar9 = gen_helper_crypto_sm4ekey;
      uVar4 = 0xf0000000000;
      break;
    case 3:
      goto switchD_006b1335_caseD_3;
    }
    goto LAB_006b137d;
  }
  uVar4 = 0xe000;
  switch(uVar7) {
  case 0:
    pcVar9 = gen_helper_crypto_sha512h;
    break;
  case 1:
    pcVar9 = gen_helper_crypto_sha512h2;
    break;
  case 2:
    pcVar9 = gen_helper_crypto_sha512su1;
    break;
  case 3:
    bVar2 = true;
    uVar4 = 0xf00000000;
    pcVar9 = (code *)0x0;
    goto LAB_006b137f;
  }
LAB_006b137d:
  bVar2 = false;
LAB_006b137f:
  if ((s->isar->id_aa64isar0 & uVar4) != 0) {
    if (s->fp_access_checked == true) {
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    uVar7 = insn >> 0x10 & 0x1f;
    uVar3 = insn >> 5 & 0x1f;
    if (bVar2) {
      lVar11 = 0;
      pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pTVar12 = (TCGv_i64)((long)pTVar6 - (long)s_00);
      pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar6 - (long)s_00);
      local_48[0] = ret;
      pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ret_00 = (TCGv_i64)((long)pTVar6 - (long)s_00);
      local_48[1] = ret_00;
      do {
        pTVar1 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + ((long)pTVar5 - (long)s_00),
                            (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                            (ulong)(uVar3 * 0x100 + 0xc10) + lVar11);
        pTVar1 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)pTVar12),
                            (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                            (ulong)(uVar7 * 0x100 + 0xc10) + lVar11);
        pTVar10 = *(TCGv_i64 *)((long)local_48 + lVar11);
        tcg_gen_rotli_i64_aarch64(s_00,pTVar10,pTVar12,1);
        pTVar10 = pTVar10 + (long)s_00;
        tcg_gen_op3_aarch64(s_00,INDEX_op_xor_i64,(TCGArg)pTVar10,(TCGArg)pTVar10,(TCGArg)pTVar5);
        lVar11 = lVar11 + 8;
      } while (lVar11 == 8);
      pTVar1 = s->uc->tcg_ctx;
      iVar8 = (insn & 0x1f) * 0x100;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)ret),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar8 + 0xc10));
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)ret_00),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar8 + 0xc18));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)pTVar5 - (long)s_00) + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar12 + (long)s_00));
    }
    else {
      pTVar1 = s->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      pTVar12 = (TCGv_i64)((long)pTVar5 - (long)pTVar1);
      tcg_gen_addi_i64_aarch64
                (pTVar1,pTVar12,(TCGv_i64)pTVar1->cpu_env,(ulong)((insn & 0x1f) * 0x100 + 0xc10));
      pTVar1 = s->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar5 - (long)pTVar1);
      tcg_gen_addi_i64_aarch64(pTVar1,ret,(TCGv_i64)pTVar1->cpu_env,(ulong)(uVar3 * 0x100 + 0xc10));
      pTVar1 = s->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      ret_00 = (TCGv_i64)((long)pTVar5 - (long)pTVar1);
      tcg_gen_addi_i64_aarch64
                (pTVar1,ret_00,(TCGv_i64)pTVar1->cpu_env,(ulong)(uVar7 * 0x100 + 0xc10));
      (*pcVar9)(s_00,pTVar12,ret,ret_00);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar12 + (long)s_00));
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
    return;
  }
switchD_006b1335_caseD_3:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_crypto_three_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int o =  extract32(insn, 14, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool feature;
    CryptoThreeOpFn *genfn;

    if (o == 0) {
        switch (opcode) {
        case 0: /* SHA512H */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h;
            break;
        case 1: /* SHA512H2 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h2;
            break;
        case 2: /* SHA512SU1 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512su1;
            break;
        case 3: /* RAX1 */
            feature = dc_isar_feature(aa64_sha3, s);
            genfn = NULL;
            break;
        default:
            g_assert_not_reached();
        }
    } else {
        switch (opcode) {
        case 0: /* SM3PARTW1 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw1;
            break;
        case 1: /* SM3PARTW2 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw2;
            break;
        case 2: /* SM4EKEY */
            feature = dc_isar_feature(aa64_sm4, s);
            genfn = gen_helper_crypto_sm4ekey;
            break;
        default:
            unallocated_encoding(s);
            return;
        }
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (genfn) {
        TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;

        tcg_rd_ptr = vec_full_reg_ptr(s, rd);
        tcg_rn_ptr = vec_full_reg_ptr(s, rn);
        tcg_rm_ptr = vec_full_reg_ptr(s, rm);

        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);

        tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
    } else {
        TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
        int pass;

        tcg_op1 = tcg_temp_new_i64(tcg_ctx);
        tcg_op2 = tcg_temp_new_i64(tcg_ctx);
        tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
        tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

        for (pass = 0; pass < 2; pass++) {
            read_vec_element(s, tcg_op1, rn, pass, MO_64);
            read_vec_element(s, tcg_op2, rm, pass, MO_64);

            tcg_gen_rotli_i64(tcg_ctx, tcg_res[pass], tcg_op2, 1);
            tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_op1);
        }
        write_vec_element(s, tcg_res[0], rd, 0, MO_64);
        write_vec_element(s, tcg_res[1], rd, 1, MO_64);

        tcg_temp_free_i64(tcg_ctx, tcg_op1);
        tcg_temp_free_i64(tcg_ctx, tcg_op2);
        tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
        tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
    }
}